

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_MoveCtorOnArena_Test::TestBody(ArenaTest_MoveCtorOnArena_Test *this)

{
  NestedTestAllTypes *from;
  TestAllTypes *pTVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  NestedTestAllTypes *this_00;
  uint64_t uVar3;
  Arena *arena_00;
  char *pcVar4;
  uint64_t usage_by_move;
  uint64_t usage_original;
  Arena arena;
  internal local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  AssertHelper local_e0;
  AssertHelper local_d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  ThreadSafeArena local_c8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c8);
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceUsed(&local_c8);
  local_d8.data_ = (AssertHelperData *)((ulong)local_d8.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_f8,"arena.SpaceUsed()","0",(unsigned_long *)&local_d0,(int *)&local_d8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar4 = (local_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1a7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
  }
  else {
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    from = (NestedTestAllTypes *)
           Arena::DefaultConstruct<proto2_unittest::NestedTestAllTypes>((Arena *)&local_c8);
    *(byte *)&from->field_0 = *(byte *)&from->field_0 | 2;
    pTVar1 = (from->field_0)._impl_.payload_;
    if (pTVar1 == (TestAllTypes *)0x0) {
      arena_00 = (Arena *)(from->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena_00 & 1) != 0) {
        arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
      }
      pTVar1 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(arena_00);
      (from->field_0)._impl_.payload_ = pTVar1;
    }
    TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
    pTVar1 = (from->field_0)._impl_.payload_;
    if (pTVar1 == (TestAllTypes *)0x0) {
      pTVar1 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
    }
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
    pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             protobuf::internal::ThreadSafeArena::SpaceUsed(&local_c8);
    local_d0._M_head_impl = pbVar2;
    this_00 = (NestedTestAllTypes *)Arena::Allocate((Arena *)&local_c8,0x50);
    proto2_unittest::NestedTestAllTypes::NestedTestAllTypes(this_00,(Arena *)&local_c8,from);
    uVar3 = protobuf::internal::ThreadSafeArena::SpaceUsed(&local_c8);
    local_d8.data_ = (AssertHelperData *)(uVar3 - (long)pbVar2);
    pTVar1 = (this_00->field_0)._impl_.payload_;
    if (pTVar1 == (TestAllTypes *)0x0) {
      pTVar1 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
    }
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x50;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_f8,"usage_by_move","sizeof(NestedTestAllTypes)",(unsigned_long *)&local_d8,
               (unsigned_long *)&local_e8);
    if (local_f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e8);
      if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1b4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e8._M_head_impl + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&local_d8.data_[0xe].message.field_2 + 8);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              (local_f8,"usage_by_move + sizeof(TestAllTypes)","usage_original",
               (unsigned_long *)&local_e8,(unsigned_long *)&local_d0);
    if (local_f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e8);
      if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_f0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1b5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e8._M_head_impl + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    pTVar1 = (from->field_0)._impl_.payload_;
    if (pTVar1 == (TestAllTypes *)0x0) {
      pTVar1 = (TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_;
    }
    TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(pTVar1);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c8);
  return;
}

Assistant:

TEST(ArenaTest, MoveCtorOnArena) {
  Arena arena;

  ASSERT_EQ(arena.SpaceUsed(), 0);

  auto* original = Arena::Create<NestedTestAllTypes>(&arena);
  TestUtil::SetAllFields(original->mutable_payload());
  TestUtil::ExpectAllFieldsSet(original->payload());

  auto usage_original = arena.SpaceUsed();
  auto* moved = Arena::Create<NestedTestAllTypes>(&arena, std::move(*original));
  auto usage_by_move = arena.SpaceUsed() - usage_original;

  TestUtil::ExpectAllFieldsSet(moved->payload());

  // The only extra allocation with moves is sizeof(NestedTestAllTypes).
  EXPECT_EQ(usage_by_move, sizeof(NestedTestAllTypes));
  EXPECT_LT(usage_by_move + sizeof(TestAllTypes), usage_original);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  TestUtil::ExpectClear(original->payload());
}